

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgOneDimensionalWrapper.hpp
# Opt level: O0

void __thiscall
TasGrid::OneDimensionalWrapper::OneDimensionalWrapper
          (OneDimensionalWrapper *this,int max_level,TypeOneDRule crule,double alpha,double beta)

{
  CustomTabulated local_b0;
  double local_28;
  double beta_local;
  double alpha_local;
  TypeOneDRule crule_local;
  int max_level_local;
  OneDimensionalWrapper *this_local;
  
  local_28 = beta;
  beta_local = alpha;
  alpha_local._0_4_ = crule;
  alpha_local._4_4_ = max_level;
  _crule_local = this;
  CustomTabulated::CustomTabulated(&local_b0);
  OneDimensionalWrapper(this,&local_b0,alpha_local._4_4_,alpha_local._0_4_,beta_local,local_28);
  CustomTabulated::~CustomTabulated(&local_b0);
  return;
}

Assistant:

OneDimensionalWrapper(int max_level, TypeOneDRule crule, double alpha, double beta) :
        OneDimensionalWrapper(CustomTabulated(), max_level, crule, alpha, beta){}